

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QGenericArrayOps<QFileDialogPrivate::HistoryItem>::moveAppend
          (QGenericArrayOps<QFileDialogPrivate::HistoryItem> *this,HistoryItem *b,HistoryItem *e)

{
  qsizetype *pqVar1;
  HistoryItem *pHVar2;
  long lVar3;
  Data *pDVar4;
  char16_t *pcVar5;
  qsizetype qVar6;
  Data *pDVar7;
  QPersistentModelIndex *pQVar8;
  
  if ((b != e) && (b < e)) {
    pHVar2 = (this->super_QArrayDataPointer<QFileDialogPrivate::HistoryItem>).ptr;
    do {
      lVar3 = (this->super_QArrayDataPointer<QFileDialogPrivate::HistoryItem>).size;
      pDVar4 = (b->path).d.d;
      (b->path).d.d = (Data *)0x0;
      pHVar2[lVar3].path.d.d = pDVar4;
      pcVar5 = (b->path).d.ptr;
      (b->path).d.ptr = (char16_t *)0x0;
      pHVar2[lVar3].path.d.ptr = pcVar5;
      qVar6 = (b->path).d.size;
      (b->path).d.size = 0;
      pHVar2[lVar3].path.d.size = qVar6;
      pDVar7 = (b->selection).d.d;
      (b->selection).d.d = (Data *)0x0;
      pHVar2[lVar3].selection.d.d = pDVar7;
      pQVar8 = (b->selection).d.ptr;
      (b->selection).d.ptr = (QPersistentModelIndex *)0x0;
      pHVar2[lVar3].selection.d.ptr = pQVar8;
      qVar6 = (b->selection).d.size;
      (b->selection).d.size = 0;
      pHVar2[lVar3].selection.d.size = qVar6;
      b = b + 1;
      pqVar1 = &(this->super_QArrayDataPointer<QFileDialogPrivate::HistoryItem>).size;
      *pqVar1 = *pqVar1 + 1;
    } while (b < e);
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }